

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRenderingInputAttachmentIndexInfoKHR *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  GenericStringRef<char> local_98;
  GenericStringRef<char> local_88;
  GenericStringRef<char> local_78;
  uint local_64;
  undefined1 local_60 [4];
  uint32_t i;
  Value range;
  GenericStringRef<char> local_40;
  undefined1 local_30 [8];
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkRenderingInputAttachmentIndexInfoKHR *create_info_local;
  
  value.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_40,(char (*) [6])"sType");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,&local_40,create_info->sType,alloc);
  rapidjson::GenericStringRef<char>::GenericStringRef<21u>
            ((GenericStringRef<char> *)((long)&range.data_ + 8),
             (char (*) [21])"colorAttachmentCount");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,(StringRefType *)((long)&range.data_ + 8),create_info->colorAttachmentCount
             ,alloc);
  if (create_info->pColorAttachmentInputIndices != (uint32_t *)0x0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_60,kArrayType);
    for (local_64 = 0; local_64 < create_info->colorAttachmentCount; local_64 = local_64 + 1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<unsigned_int>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_60,create_info->pColorAttachmentInputIndices[local_64],alloc);
    }
    rapidjson::GenericStringRef<char>::GenericStringRef<28u>
              (&local_78,(char (*) [28])"colorAttachmentInputIndices");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_30,&local_78,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_60,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_60);
  }
  if (create_info->pDepthInputAttachmentIndex != (uint32_t *)0x0) {
    rapidjson::GenericStringRef<char>::GenericStringRef<26u>
              (&local_88,(char (*) [26])"depthInputAttachmentIndex");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,&local_88,*create_info->pDepthInputAttachmentIndex,alloc);
  }
  if (create_info->pStencilInputAttachmentIndex != (uint32_t *)0x0) {
    rapidjson::GenericStringRef<char>::GenericStringRef<28u>
              (&local_98,(char (*) [28])"stencilInputAttachmentIndex");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,&local_98,*create_info->pStencilInputAttachmentIndex,alloc);
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(value.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_30);
  return true;
}

Assistant:

static bool json_value(const VkRenderingInputAttachmentIndexInfoKHR &create_info, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);
	value.AddMember("colorAttachmentCount", create_info.colorAttachmentCount, alloc);

	if (create_info.pColorAttachmentInputIndices)
	{
		Value range(kArrayType);
		for (uint32_t i = 0; i < create_info.colorAttachmentCount; i++)
			range.PushBack(create_info.pColorAttachmentInputIndices[i], alloc);
		value.AddMember("colorAttachmentInputIndices", range, alloc);
	}

	if (create_info.pDepthInputAttachmentIndex)
		value.AddMember("depthInputAttachmentIndex", *create_info.pDepthInputAttachmentIndex, alloc);
	if (create_info.pStencilInputAttachmentIndex)
		value.AddMember("stencilInputAttachmentIndex", *create_info.pStencilInputAttachmentIndex, alloc);

	*out_value = value;
	return true;
}